

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

VkPrimitiveTopology vkt::FragmentOperations::anon_unknown_0::getTopology(TestPrimitive primitive)

{
  VkPrimitiveTopology local_c;
  TestPrimitive primitive_local;
  
  switch(primitive) {
  case TEST_PRIMITIVE_POINTS:
    local_c = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    break;
  case TEST_PRIMITIVE_LINES:
  case TEST_PRIMITIVE_BIG_LINE:
    local_c = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
    break;
  case TEST_PRIMITIVE_TRIANGLES:
  case TEST_PRIMITIVE_BIG_TRIANGLE:
    local_c = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    break;
  default:
    local_c = VK_PRIMITIVE_TOPOLOGY_LAST;
  }
  return local_c;
}

Assistant:

VkPrimitiveTopology	getTopology (const TestPrimitive primitive)
{
	switch (primitive)
	{
		case TEST_PRIMITIVE_POINTS:			return VK_PRIMITIVE_TOPOLOGY_POINT_LIST;

		case TEST_PRIMITIVE_LINES:
		case TEST_PRIMITIVE_BIG_LINE:		return VK_PRIMITIVE_TOPOLOGY_LINE_LIST;

		case TEST_PRIMITIVE_TRIANGLES:
		case TEST_PRIMITIVE_BIG_TRIANGLE:	return VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;

		default:
			DE_ASSERT(0);
			return VK_PRIMITIVE_TOPOLOGY_LAST;
	}
}